

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O1

optional<svg::Point> *
svg::getMaxPoint(optional<svg::Point> *__return_storage_ptr__,
                vector<svg::Point,_std::allocator<svg::Point>_> *points)

{
  pointer pPVar1;
  pointer pPVar2;
  double *pdVar3;
  uint uVar4;
  ulong uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double dVar10;
  double dVar11;
  
  pPVar1 = (points->super__Vector_base<svg::Point,_std::allocator<svg::Point>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (points->super__Vector_base<svg::Point,_std::allocator<svg::Point>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar1 != pPVar2) {
    pdVar3 = &pPVar1->y;
    uVar4 = 1;
    uVar6 = SUB84(pPVar1->x,0);
    uVar8 = (int)((ulong)pPVar1->x >> 0x20);
    dVar10 = pPVar1->y;
    do {
      dVar11 = ((Point *)(pdVar3 + -1))->x;
      uVar7 = SUB84(dVar11,0);
      uVar9 = (int)((ulong)dVar11 >> 0x20);
      if (dVar11 <= (double)CONCAT44(uVar8,uVar6)) {
        uVar7 = uVar6;
        uVar9 = uVar8;
      }
      dVar11 = *pdVar3;
      if (*pdVar3 <= dVar10) {
        dVar11 = dVar10;
      }
      uVar5 = (ulong)uVar4;
      pdVar3 = pdVar3 + 2;
      uVar4 = uVar4 + 1;
      uVar6 = uVar7;
      uVar8 = uVar9;
      dVar10 = dVar11;
    } while (uVar5 < (ulong)((long)pPVar2 - (long)pPVar1 >> 4));
    __return_storage_ptr__->valid = true;
    (__return_storage_ptr__->type).x = (double)CONCAT44(uVar9,uVar7);
    (__return_storage_ptr__->type).y = dVar11;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->valid = false;
  (__return_storage_ptr__->type).x = 0.0;
  (__return_storage_ptr__->type).y = 0.0;
  return __return_storage_ptr__;
}

Assistant:

optional<Point> getMaxPoint(std::vector<Point> const & points)
    {
        if (points.empty())
            return optional<Point>();

        Point max = points[0];
        for (unsigned i = 0; i < points.size(); ++i) {
            if (points[i].x > max.x)
                max.x = points[i].x;
            if (points[i].y > max.y)
                max.y = points[i].y;
        }
        return optional<Point>(max);
    }